

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O0

void __thiscall ClipperLib::PolyTree::~PolyTree(PolyTree *this)

{
  PolyTree *this_local;
  
  (this->super_PolyNode)._vptr_PolyNode = (_func_int **)&PTR__PolyTree_0016ad68;
  Clear(this);
  std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::~vector
            (&this->AllNodes);
  PolyNode::~PolyNode(&this->super_PolyNode);
  return;
}

Assistant:

~PolyTree(){ Clear(); }